

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::prog_tmp(SSPMSolver *this,int pindex,int h)

{
  int iVar1;
  int iVar2;
  uint64_t *puVar3;
  byte bVar4;
  int k;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  piVar10 = this->tmp_d;
  iVar1 = *piVar10;
  if (iVar1 != -1) {
    iVar8 = this->l;
    puVar3 = (this->tmp_b)._bits;
    uVar11 = (ulong)iVar8;
    uVar6 = uVar11 - 1;
    if (pindex < piVar10[uVar11 - 1]) {
      for (; (-1 < (int)uVar6 && (uVar9 = uVar6 & 0xffffffff, pindex < piVar10[uVar9]));
          uVar6 = (ulong)((int)uVar6 - 1)) {
        bVar4 = (byte)uVar9 & 0x3f;
        uVar11 = uVar11 - 1;
        puVar3[uVar6 >> 6 & 0x3ffffff] =
             puVar3[uVar6 >> 6 & 0x3ffffff] & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        piVar10[uVar9] = pindex;
      }
      puVar3[uVar11 >> 6] = puVar3[uVar11 >> 6] | 1L << (uVar11 & 0x3f);
    }
    else {
      while (iVar5 = (int)uVar6, -1 < iVar5) {
        uVar12 = uVar6 >> 6 & 0x3ffffff;
        uVar13 = 1L << (uVar6 & 0x3f);
        uVar9 = uVar6 & 0xffffffff;
        uVar11 = puVar3[uVar12];
        if ((uVar11 >> (uVar6 & 0x3f) & 1) == 0) {
          iVar1 = piVar10[uVar9];
          if (iVar1 == h) {
            puVar3[uVar12] = uVar11 | uVar13;
            return;
          }
          puVar3[uVar12] = ~uVar13 & uVar11;
          piVar10 = piVar10 + uVar9;
          for (; (int)uVar6 < iVar8; uVar6 = (ulong)((int)uVar6 + 1)) {
            *piVar10 = iVar1 + 1;
            piVar10 = piVar10 + 1;
            iVar8 = this->l;
          }
          return;
        }
        if (iVar5 == 0) {
          if (iVar1 != 0) {
            *(byte *)puVar3 = (byte)*puVar3 | 1;
            for (lVar7 = 0; lVar7 < iVar8; lVar7 = lVar7 + 1) {
              piVar10[lVar7] = iVar1 + -1;
              iVar8 = this->l;
            }
            return;
          }
          *(byte *)puVar3 = (byte)*puVar3 & 0xfe;
          *piVar10 = -1;
          return;
        }
        iVar2 = piVar10[uVar9];
        if (piVar10[uVar9 - 1] != iVar2) {
          piVar10 = piVar10 + uVar9;
          puVar3[uVar12] = uVar11 | uVar13;
          for (; (int)uVar6 < iVar8; uVar6 = (ulong)((int)uVar6 + 1)) {
            *piVar10 = iVar2 + -1;
            piVar10 = piVar10 + 1;
            iVar8 = this->l;
          }
          return;
        }
        puVar3[uVar12] = ~uVar13 & uVar11;
        uVar6 = (ulong)(iVar5 - 1);
      }
    }
  }
  return;
}

Assistant:

void
SSPMSolver::prog_tmp(int pindex, int h)
{
    // Simple case 1: Top >_p Top
    if (tmp_d[0] == -1) return; // already Top

    // Simple case 2: Some bits below [pindex], ergo [pindex] can go from ..e to ..10*
    if (tmp_d[l-1] > pindex) {
        int i;
        for (i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
            tmp_b[i] = 0;
            tmp_d[i] = pindex;
        }
        tmp_b[i+1] = 1;
        return;
    }

    // Case 3: no bits below [pindex], so analyze lowest nonempty level
    // * If lowest contains 0: 3a or 3b
    // * Else if lowest level is root: 3c
    // * Else append 100000000... to next higher level (3d, 3e, 3f)
    //
    // 3a: ,..011*  => ,..100*  (if lowest nonempty is the bottom)
    // 3b: ,..011*, => ,..,000* (if lowest nonempty is not the bottom)
    // 3c: 1111111  => Top      (if root contains only 1s)
    // 3d: ,1111111 => 100*     (if non-root contains only 1s)
    // 3e: ..,111*  => ..100*
    // 3f: ,e,111*  => ,100*

    // no bits below pindex, so just find smallest increase
    for (int i=l-1; i>=0; i--) {
        if (tmp_b[i] == 0) {
            if (tmp_d[i] == h) {
                // 3a: we found a 0 on the bottom, increase to 100...
                // ..011 => 00100
                tmp_b[i] = 1;
                break;
            } else {
                // 3b: we found a 0 (not bottom), increase to [eps] and 0s on leaf
                // ..011 => ..,000
                tmp_b[i] = 0;
                int new_d = tmp_d[i]+1;
                for (int k=i; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (i == 0) {
            // we have only seen 1s and only 1 element
            if (tmp_d[0] == 0) {
                // 3c: we are already the highest, so go to top
                tmp_b[0] = 0;
                tmp_d[0] = -1;
                break;
            } else {
                // 3d: increase 1 higher...
                // ,e,111   => ,100
                int new_d = tmp_d[0]-1;
                tmp_b[0] = 1;
                for (int k=0; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (tmp_d[i-1] != tmp_d[i]) {
            // 3e, 3f: next is different
            // two cases
            //  .,111   => .100
            // ,e,111   => ,100
            int new_d = tmp_d[i]-1;
            tmp_b[i] = 1;
            for (int k=i; k<l; k++) tmp_d[k] = new_d;
            break;
        } else {
            // next is same
            tmp_b[i] = 0;
        }
    }
}